

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[4],kj::Repeat<char>,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [4],Repeat<char> *params_1,
          char (*params_2) [2])

{
  Repeat<char> *local_58;
  size_t local_50;
  ArrayPtr<const_char> local_48;
  kj *local_38;
  size_t local_30;
  
  local_30 = strlen((char *)this);
  local_48.ptr._0_1_ = (*params)[0];
  local_48.size_ = *(size_t *)(params + 2);
  local_38 = this;
  local_50 = strlen(&params_1->value);
  local_58 = params_1;
  _::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,(Repeat<char> *)&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}